

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SliceBase.h
# Opt level: O1

uint64_t __thiscall
arangodb::velocypack::SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::
volatileHash(SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *this)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  ValueLength VVar13;
  byte *pbVar14;
  ulong uVar15;
  ulong uVar16;
  uint64_t uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong *puVar20;
  
  VVar13 = (ValueLength)"\x01\x01"[**(byte **)this];
  if (VVar13 == 0) {
    VVar13 = byteSizeDynamic(this,*(byte **)this);
  }
  puVar20 = *(ulong **)this;
  if (VVar13 == 1) {
    uVar17 = SliceStaticData::PrecalculatedHashesForDefaultSeedWYHash[(byte)*puVar20];
  }
  else {
    uVar18 = 0xa0761d64a610dac0;
    if (VVar13 < 0x11) {
      if (VVar13 < 4) {
        if (VVar13 == 0) {
          uVar16 = 0;
        }
        else {
          uVar16 = (ulong)*(byte *)((long)puVar20 + (VVar13 - 1)) |
                   (ulong)((uint)*(byte *)((long)puVar20 + (VVar13 >> 1)) << 8 |
                          (uint)(byte)*puVar20 << 0x10);
        }
        uVar15 = 0;
      }
      else {
        uVar15 = (ulong)((uint)(VVar13 >> 1) & 0xc);
        uVar16 = CONCAT44((int)*puVar20,*(undefined4 *)((long)puVar20 + uVar15));
        pbVar14 = (byte *)((long)puVar20 + (VVar13 - 4));
        uVar15 = CONCAT44(*(undefined4 *)pbVar14,*(undefined4 *)(pbVar14 + -uVar15));
      }
    }
    else {
      uVar15 = VVar13;
      if (0x30 < VVar13) {
        uVar16 = 0xa0761d64a610dac0;
        uVar19 = 0xa0761d64a610dac0;
        do {
          auVar4._8_8_ = 0;
          auVar4._0_8_ = uVar18 ^ puVar20[1];
          auVar10._8_8_ = 0;
          auVar10._0_8_ = *puVar20 ^ 0xe7037ed1a0b428db;
          uVar18 = SUB168(auVar4 * auVar10,8) ^ SUB168(auVar4 * auVar10,0);
          auVar5._8_8_ = 0;
          auVar5._0_8_ = uVar16 ^ puVar20[3];
          auVar11._8_8_ = 0;
          auVar11._0_8_ = puVar20[2] ^ 0x8ebc6af09c88c6e3;
          uVar16 = SUB168(auVar5 * auVar11,8) ^ SUB168(auVar5 * auVar11,0);
          auVar6._8_8_ = 0;
          auVar6._0_8_ = uVar19 ^ puVar20[5];
          auVar12._8_8_ = 0;
          auVar12._0_8_ = puVar20[4] ^ 0x589965cc75374cc3;
          uVar19 = SUB168(auVar6 * auVar12,8) ^ SUB168(auVar6 * auVar12,0);
          puVar20 = puVar20 + 6;
          uVar15 = uVar15 - 0x30;
        } while (0x30 < uVar15);
        uVar18 = uVar16 ^ uVar18 ^ uVar19;
      }
      for (; 0x10 < uVar15; uVar15 = uVar15 - 0x10) {
        auVar3._8_8_ = 0;
        auVar3._0_8_ = uVar18 ^ puVar20[1];
        auVar9._8_8_ = 0;
        auVar9._0_8_ = *puVar20 ^ 0xe7037ed1a0b428db;
        uVar18 = SUB168(auVar3 * auVar9,8) ^ SUB168(auVar3 * auVar9,0);
        puVar20 = puVar20 + 2;
      }
      uVar16 = *(ulong *)((long)puVar20 + (uVar15 - 0x10));
      uVar15 = *(ulong *)((long)puVar20 + (uVar15 - 8));
    }
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uVar18 ^ uVar15;
    auVar7._8_8_ = 0;
    auVar7._0_8_ = uVar16 ^ 0xe7037ed1a0b428db;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = SUB168(auVar1 * auVar7,0) ^ SUB168(auVar1 * auVar7,8);
    auVar8._8_8_ = 0;
    auVar8._0_8_ = VVar13 ^ 0xe7037ed1a0b428db;
    uVar17 = SUB168(auVar2 * auVar8,8) ^ SUB168(auVar2 * auVar8,0);
  }
  return uVar17;
}

Assistant:

inline uint64_t volatileHash() const {
    std::size_t const size = checkOverflow(byteSize());
    if (size == 1) {
      uint64_t h =
          SliceStaticData::PrecalculatedHashesForDefaultSeedWYHash[head()];
      VELOCYPACK_ASSERT(h != 0);
      return h;
    }
    return VELOCYPACK_HASH_WYHASH(start(), size, defaultSeed64);
  }